

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O2

Vector2f __thiscall Rml::Box::GetPosition(Box *this,BoxArea area)

{
  code *pcVar1;
  Vector2f VVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  
  if (area == Auto) {
    bVar3 = Assert("RMLUI_ASSERT(area != BoxArea::Auto)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Box.cpp"
                   ,0x29);
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  fVar6 = -this->area_edges[0][3];
  fVar7 = -this->area_edges[0][0];
  uVar4 = 0;
  uVar5 = (ulong)area;
  if ((int)area < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
    fVar6 = fVar6 + *(float *)((long)this->area_edges[0] + uVar4 + 0xc);
    fVar7 = fVar7 + *(float *)((long)this->area_edges[0] + uVar4);
  }
  VVar2.y = fVar7;
  VVar2.x = fVar6;
  return VVar2;
}

Assistant:

Vector2f Box::GetPosition(BoxArea area) const
{
	RMLUI_ASSERT(area != BoxArea::Auto);
	Vector2f area_position(-GetEdge(BoxArea::Margin, BoxEdge::Left), -GetEdge(BoxArea::Margin, BoxEdge::Top));
	for (int i = 0; i < (int)area; i++)
	{
		area_position.x += area_edges[i][(int)BoxEdge::Left];
		area_position.y += area_edges[i][(int)BoxEdge::Top];
	}

	return area_position;
}